

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdInvalidateZcull::emulate_mthd(MthdInvalidateZcull *this)

{
  uint uVar1;
  
  pgraph_celsius_pre_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.skip = true;
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    if (((this->super_SingleMthdTest).super_MthdTest.val & 1) == 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.zcull_unka00[0] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_clear_hv[0] +
           0x10000 & 0x1fff0000 |
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.zcull_unka00[0] &
           0xe000e000 | 0x1000;
      uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_clear_hv[1] +
              0x10000 & 0x1fff0000 |
              (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.zcull_unka00[1] &
              0xe000e000 | 0x1000;
    }
    else {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.zcull_unka00[0] = 0;
      uVar1 = 0;
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.zcull_unka00[1] = uVar1;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		// XXX completely broken
		skip = true;
		if (!extr(exp.nsource, 1, 1)) {
			if (val & 1) {
				exp.zcull_unka00[0] = 0;
				exp.zcull_unka00[1] = 0;
			} else {
				insrt(exp.zcull_unka00[0], 0, 13, 0x1000);
				insrt(exp.zcull_unka00[1], 0, 13, 0x1000);
				insrt(exp.zcull_unka00[0], 16, 13, extr(exp.bundle_clear_hv[0], 16, 16) + 1);
				insrt(exp.zcull_unka00[1], 16, 13, extr(exp.bundle_clear_hv[1], 16, 16) + 1);
			}
		}
	}